

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *dummy,
          ServiceDescriptor *result)

{
  Tables *pTVar1;
  Symbol symbol;
  void *proto_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  ulong uVar6;
  MethodDescriptorProto *proto_01;
  ServiceOptions *orig_options;
  string *name;
  Symbol local_48;
  int local_34;
  string *psStack_30;
  int i;
  string *full_name;
  ServiceDescriptor *result_local;
  void *dummy_local;
  ServiceDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  pTVar1 = this->tables_;
  full_name = (string *)result;
  result_local = (ServiceDescriptor *)dummy;
  dummy_local = proto;
  proto_local = (ServiceDescriptorProto *)this;
  psVar5 = FileDescriptor::package_abi_cxx11_(this->file_);
  psStack_30 = DescriptorPool::Tables::AllocateString(pTVar1,psVar5);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::append((ulong)psStack_30,'\x01');
  }
  psVar5 = psStack_30;
  ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)dummy_local);
  std::__cxx11::string::append((string *)psVar5);
  psVar5 = ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)dummy_local);
  ValidateSymbolName(this,psVar5,psStack_30,(Message *)dummy_local);
  pTVar1 = this->tables_;
  psVar5 = ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)dummy_local);
  psVar5 = DescriptorPool::Tables::AllocateString(pTVar1,psVar5);
  *(string **)full_name = psVar5;
  full_name->_M_string_length = (size_type)psStack_30;
  (full_name->field_2)._M_allocated_capacity = (size_type)this->file_;
  iVar3 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)dummy_local);
  *(int *)(full_name + 1) = iVar3;
  iVar3 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)dummy_local);
  AllocateArray<google::protobuf::MethodDescriptor>
            (this,iVar3,(MethodDescriptor **)&full_name[1]._M_string_length);
  local_34 = 0;
  while( true ) {
    iVar3 = local_34;
    iVar4 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)dummy_local);
    if (iVar4 <= iVar3) break;
    proto_01 = ServiceDescriptorProto::method((ServiceDescriptorProto *)dummy_local,local_34);
    BuildMethod(this,proto_01,(ServiceDescriptor *)full_name,
                (MethodDescriptor *)(full_name[1]._M_string_length + (long)local_34 * 0x30));
    local_34 = local_34 + 1;
  }
  bVar2 = ServiceDescriptorProto::has_options((ServiceDescriptorProto *)dummy_local);
  if (bVar2) {
    orig_options = ServiceDescriptorProto::options((ServiceDescriptorProto *)dummy_local);
    AllocateOptions<google::protobuf::ServiceDescriptor>
              (this,orig_options,(ServiceDescriptor *)full_name);
  }
  else {
    *(undefined8 *)((long)&full_name->field_2 + 8) = 0;
  }
  psVar5 = ServiceDescriptor::full_name_abi_cxx11_((ServiceDescriptor *)full_name);
  name = ServiceDescriptor::name_abi_cxx11_((ServiceDescriptor *)full_name);
  proto_00 = dummy_local;
  anon_unknown_1::Symbol::Symbol(&local_48,(ServiceDescriptor *)full_name);
  symbol.field_1.descriptor = local_48.field_1.descriptor;
  symbol.type = local_48.type;
  symbol._4_4_ = local_48._4_4_;
  AddSymbol(this,psVar5,(void *)0x0,name,(Message *)proto_00,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* dummy,
                                     ServiceDescriptor* result) {
  string* full_name = tables_->AllocateString(file_->package());
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_      = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_      = file_;

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), NULL, result->name(),
            proto, Symbol(result));
}